

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_key_derivation_abort(psa_key_derivation_operation_t *operation)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  psa_status_t pVar4;
  anon_union_520_3_d4bb1366_for_ctx *paVar5;
  long lStack_30;
  
  uVar1 = operation->alg;
  uVar3 = uVar1 & 0x2003ffff;
  if ((uVar1 & 0x7f000000) != 0x30000000) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    pVar4 = 0;
    goto LAB_00128f31;
  }
  uVar3 = uVar3 & 0xffffff00;
  if ((uVar3 == 0x20000300) || (uVar3 == 0x20000200)) {
    puVar2 = (operation->ctx).tls12_prf.seed;
    if (puVar2 != (uint8_t *)0x0) {
      mbedtls_platform_zeroize(puVar2,(operation->ctx).tls12_prf.seed_length);
      free((operation->ctx).tls12_prf.seed);
    }
    puVar2 = (operation->ctx).tls12_prf.label;
    if (puVar2 != (uint8_t *)0x0) {
      paVar5 = (anon_union_520_3_d4bb1366_for_ctx *)&(operation->ctx).hkdf.hmac.hash_ctx.ctx;
      mbedtls_platform_zeroize(puVar2,(operation->ctx).tls12_prf.label_length);
      lStack_30 = 0x38;
      goto LAB_00128f14;
    }
    lStack_30 = 0x38;
  }
  else {
    pVar4 = -0x89;
    if (uVar3 != 0x20000100) goto LAB_00128f31;
    paVar5 = &operation->ctx;
    lStack_30 = 0x20;
LAB_00128f14:
    free((paVar5->hkdf).info);
  }
  pVar4 = psa_hmac_abort_internal((psa_hmac_internal_data *)((long)&operation->alg + lStack_30));
LAB_00128f31:
  mbedtls_platform_zeroize(operation,0x218);
  return pVar4;
}

Assistant:

psa_status_t psa_key_derivation_abort( psa_key_derivation_operation_t *operation )
{
    psa_status_t status = PSA_SUCCESS;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );
    if( kdf_alg == 0 )
    {
        /* The object has (apparently) been initialized but it is not
         * in use. It's ok to call abort on such an object, and there's
         * nothing to do. */
    }
    else
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        mbedtls_free( operation->ctx.hkdf.info );
        status = psa_hmac_abort_internal( &operation->ctx.hkdf.hmac );
    }
    else if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
             /* TLS-1.2 PSK-to-MS KDF uses the same core as TLS-1.2 PRF */
             PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        if( operation->ctx.tls12_prf.seed != NULL )
        {
            mbedtls_platform_zeroize( operation->ctx.tls12_prf.seed,
                                      operation->ctx.tls12_prf.seed_length );
            mbedtls_free( operation->ctx.tls12_prf.seed );
        }

        if( operation->ctx.tls12_prf.label != NULL )
        {
            mbedtls_platform_zeroize( operation->ctx.tls12_prf.label,
                                      operation->ctx.tls12_prf.label_length );
            mbedtls_free( operation->ctx.tls12_prf.label );
        }

        status = psa_hmac_abort_internal( &operation->ctx.tls12_prf.hmac );

        /* We leave the fields Ai and output_block to be erased safely by the
         * mbedtls_platform_zeroize() in the end of this function. */
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        status = PSA_ERROR_BAD_STATE;
    }
    mbedtls_platform_zeroize( operation, sizeof( *operation ) );
    return( status );
}